

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SphereLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,SphereLight *light
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Base_ptr __k;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  Property *args;
  char *pcVar12;
  bool bVar13;
  char *pcVar14;
  string *psVar15;
  _Rb_tree_header *p_Var16;
  ParseResult ret;
  Attribute *attr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string local_360;
  undefined1 local_340 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_328;
  string *local_318;
  Property *local_310;
  long *local_308 [2];
  long local_2f8 [2];
  string *local_2e8;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2e0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2a0;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_298;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_290;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_288;
  _Base_ptr local_280;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_278;
  string local_270;
  undefined1 local_250 [16];
  code *local_240;
  code *pcStack_238;
  ios_base local_1e0 [264];
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  string local_b8;
  string local_98;
  string local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d0._M_impl.super__Rb_tree_header._M_header;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar13 = false;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318 = err;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2d0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar5) {
    p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar13 = true;
    if ((_Rb_tree_header *)p_Var11 != p_Var16) {
      local_278 = &(light->super_BoundableLight).color;
      local_288 = &light->radius;
      local_290 = &(light->super_BoundableLight).intensity;
      local_298 = &(light->super_BoundableLight).extent;
      local_2a0 = &(light->super_BoundableLight).props;
      local_2e0 = &(light->super_BoundableLight).purpose;
      local_2d8 = &(light->super_BoundableLight).visibility;
      local_2e8 = warn;
      local_280 = &p_Var16->_M_header;
      do {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        local_250._0_8_ = &local_240;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"inputs:color","");
        psVar15 = (string *)local_250;
        local_310 = (Property *)(p_Var11 + 2);
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                  ((ParseResult *)local_340,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2d0,&local_270,(Property *)(p_Var11 + 2),(string *)local_250,local_278)
        ;
        if ((code **)local_250._0_8_ != &local_240) {
          operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 0;
        if ((local_340._0_8_ & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_00207b7a:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_340._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_250,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_250,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((string *)local_250,0xc8d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_308[0] = local_2f8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_308,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[13],std::__cxx11::string>
                      (&local_360,(fmt *)local_308,(string *)"inputs:color",
                       (char (*) [13])(local_340 + 8),psVar15);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_250,local_360._M_dataplus._M_p,
                                local_360._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            paVar3 = &local_360.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != paVar3) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            psVar15 = local_318;
            if (local_308[0] != local_2f8) {
              operator_delete(local_308[0],local_2f8[0] + 1);
            }
            if (psVar15 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar8 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_308,(ulong)(psVar15->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_360.field_2._M_allocated_capacity = *psVar1;
                local_360.field_2._8_8_ = plVar8[3];
                local_360._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_360.field_2._M_allocated_capacity = *psVar1;
                local_360._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_360._M_string_length = plVar8[1];
              *plVar8 = (long)psVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar15,(string *)&local_360);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != paVar3) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              if (local_308[0] != local_2f8) {
                operator_delete(local_308[0],local_2f8[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
            ::std::ios_base::~ios_base(local_1e0);
            iVar6 = 1;
            goto LAB_00207b7a;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._8_8_ != &aStack_328) {
          operator_delete((void *)local_340._8_8_,aStack_328._M_allocated_capacity + 1);
        }
        if (bVar5) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_250._0_8_ = &local_240;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"inputs:radius","");
          psVar15 = (string *)local_250;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_340,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,&local_78,local_310,(string *)local_250,local_288);
          if ((code **)local_250._0_8_ != &local_240) {
            operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          iVar6 = 0;
          if ((local_340._0_8_ & 0xfffffffd) == 0) {
            iVar6 = 3;
LAB_00207e70:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_340._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_250,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_250,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((string *)local_250,0xc8e);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_308[0] = local_2f8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_308,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_360,(fmt *)local_308,(string *)"inputs:radius",
                         (char (*) [14])(local_340 + 8),psVar15);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_250,local_360._M_dataplus._M_p,
                                  local_360._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              paVar3 = &local_360.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != paVar3) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              psVar15 = local_318;
              if (local_308[0] != local_2f8) {
                operator_delete(local_308[0],local_2f8[0] + 1);
              }
              if (psVar15 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar8 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_308,(ulong)(psVar15->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_360.field_2._M_allocated_capacity = *psVar1;
                  local_360.field_2._8_8_ = plVar8[3];
                  local_360._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_360.field_2._M_allocated_capacity = *psVar1;
                  local_360._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_360._M_string_length = plVar8[1];
                *plVar8 = (long)psVar1;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar15,(string *)&local_360);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != paVar3) {
                  operator_delete(local_360._M_dataplus._M_p,
                                  local_360.field_2._M_allocated_capacity + 1);
                }
                if (local_308[0] != local_2f8) {
                  operator_delete(local_308[0],local_2f8[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
              ::std::ios_base::~ios_base(local_1e0);
              iVar6 = 1;
              goto LAB_00207e70;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._8_8_ != &aStack_328) {
            operator_delete((void *)local_340._8_8_,aStack_328._M_allocated_capacity + 1);
          }
          if (!bVar5) goto LAB_0020903d;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_250._0_8_ = &local_240;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_250,"inputs:intensity","");
          psVar15 = (string *)local_250;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_340,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,&local_98,local_310,(string *)local_250,local_290);
          if ((code **)local_250._0_8_ != &local_240) {
            operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          iVar6 = 0;
          if ((local_340._0_8_ & 0xfffffffd) == 0) {
            iVar6 = 3;
LAB_00208166:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_340._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_250,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_250,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((string *)local_250,0xc90);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_308[0] = local_2f8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_308,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[17],std::__cxx11::string>
                        (&local_360,(fmt *)local_308,(string *)"inputs:intensity",
                         (char (*) [17])(local_340 + 8),psVar15);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_250,local_360._M_dataplus._M_p,
                                  local_360._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              paVar3 = &local_360.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != paVar3) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              psVar15 = local_318;
              if (local_308[0] != local_2f8) {
                operator_delete(local_308[0],local_2f8[0] + 1);
              }
              if (psVar15 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar8 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_308,(ulong)(psVar15->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_360.field_2._M_allocated_capacity = *psVar1;
                  local_360.field_2._8_8_ = plVar8[3];
                  local_360._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_360.field_2._M_allocated_capacity = *psVar1;
                  local_360._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_360._M_string_length = plVar8[1];
                *plVar8 = (long)psVar1;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar15,(string *)&local_360);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != paVar3) {
                  operator_delete(local_360._M_dataplus._M_p,
                                  local_360.field_2._M_allocated_capacity + 1);
                }
                if (local_308[0] != local_2f8) {
                  operator_delete(local_308[0],local_2f8[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
              ::std::ios_base::~ios_base(local_1e0);
              iVar6 = 1;
              goto LAB_00208166;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._8_8_ != &aStack_328) {
            operator_delete((void *)local_340._8_8_,aStack_328._M_allocated_capacity + 1);
          }
          if (!bVar5) goto LAB_0020903d;
          __k = p_Var11 + 1;
          iVar6 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar6 == 0) {
            local_250._0_8_ = &local_240;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"visibility","");
            cVar9 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_2d0,(string *)local_250);
            if ((code **)local_250._0_8_ != &local_240) {
              operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
            }
            if ((_Rb_tree_header *)cVar9._M_node == &local_2d0._M_impl.super__Rb_tree_header) {
              psVar1 = (size_type *)(local_340 + 0x10);
              if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_250,&local_310->_attrib);
                local_340._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_340._16_6_ = 0x6e656b6f74;
                if (((local_250._8_8_ == 5) &&
                    ((char)*(int *)(local_250._0_8_ + 4) == 'n' &&
                     *(int *)local_250._0_8_ == 0x656b6f74)) &&
                   (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                  local_340._0_8_ = psVar1;
                  if ((code **)local_250._0_8_ != &local_240) {
                    operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
                  }
                  if (uVar4 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_250,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_250,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_250,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_250,"():",3);
                    poVar7 = (ostream *)::std::ostream::operator<<((string *)local_250,0xc92);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_250,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_250,"visibility",10);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_250,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_250,"\n",1);
                    psVar15 = local_2e8;
                    if (local_2e8 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_340,&local_360,local_318);
                      ::std::__cxx11::string::operator=((string *)psVar15,(string *)local_340);
                      if ((size_type *)local_340._0_8_ != psVar1) {
                        operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_360._M_dataplus._M_p != &local_360.field_2) {
                        operator_delete(local_360._M_dataplus._M_p,
                                        local_360.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
                    ::std::ios_base::~ios_base(local_1e0);
                    AttrMetas::operator=(&local_2d8->_metas,(AttrMetas *)(p_Var11 + 7));
                    pcVar14 = "visibility";
                    pcVar12 = "";
LAB_00208982:
                    local_250._0_8_ = &local_240;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_250,pcVar14,pcVar12);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_2d0,(string *)local_250);
                    if ((code **)local_250._0_8_ != &local_240) {
                      operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
                    }
                    goto LAB_0020904c;
                  }
                }
                else if ((code **)local_250._0_8_ != &local_240) {
                  local_340._0_8_ = psVar1;
                  operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
                }
              }
              local_250._8_8_ = 0;
              local_250._0_8_ = VisibilityEnumHandler;
              pcStack_238 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
              local_240 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_manager;
              local_340._0_8_ = psVar1;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"visibility","")
              ;
              bVar5 = options->strict_allowedToken_check;
              local_48 = (code *)0x0;
              pcStack_40 = (code *)0x0;
              local_58._M_unused._M_object = (void *)0x0;
              local_58._8_8_ = 0;
              if (local_240 != (code *)0x0) {
                (*local_240)(&local_58,(string *)local_250,2);
                local_48 = local_240;
                pcStack_40 = pcStack_238;
              }
              bVar5 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                ((string *)local_340,bVar5,
                                 (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                                 &local_310->_attrib,local_2d8,local_2e8,local_318);
              if (local_48 != (code *)0x0) {
                (*local_48)(&local_58,&local_58,__destroy_functor);
              }
              if ((size_type *)local_340._0_8_ != psVar1) {
                operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
              }
              iVar6 = 1;
              if (bVar5) {
                AttrMetas::operator=(&local_2d8->_metas,(AttrMetas *)(p_Var11 + 7));
                pcVar14 = "visibility";
                pcVar12 = "";
LAB_00208c8b:
                local_340._0_8_ = local_340 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_340,pcVar14,pcVar12);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_2d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_340);
                if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                iVar6 = 3;
              }
LAB_00208cbd:
              if (local_240 != (code *)0x0) {
                (*local_240)((string *)local_250,(string *)local_250,3);
              }
              goto LAB_0020903d;
            }
          }
          else {
            iVar6 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar6 == 0) {
              local_250._0_8_ = &local_240;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"purpose","");
              cVar9 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_2d0,(string *)local_250);
              if ((code **)local_250._0_8_ != &local_240) {
                operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
              }
              if ((_Rb_tree_header *)cVar9._M_node == &local_2d0._M_impl.super__Rb_tree_header) {
                psVar1 = (size_type *)(local_340 + 0x10);
                if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_250,&local_310->_attrib);
                  local_340._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_340._16_6_ = 0x6e656b6f74;
                  if (((local_250._8_8_ == 5) &&
                      ((char)*(int *)(local_250._0_8_ + 4) == 'n' &&
                       *(int *)local_250._0_8_ == 0x656b6f74)) &&
                     (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                    local_340._0_8_ = psVar1;
                    if ((code **)local_250._0_8_ != &local_240) {
                      operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
                    }
                    if (uVar4 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,"():",3);
                      poVar7 = (ostream *)::std::ostream::operator<<((string *)local_250,0xc94);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,"purpose",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_250,"\n",1);
                      psVar15 = local_2e8;
                      if (local_2e8 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_340,&local_360,local_318);
                        ::std::__cxx11::string::operator=((string *)psVar15,(string *)local_340);
                        if ((size_type *)local_340._0_8_ != psVar1) {
                          operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_360._M_dataplus._M_p != &local_360.field_2) {
                          operator_delete(local_360._M_dataplus._M_p,
                                          local_360.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
                      ::std::ios_base::~ios_base(local_1e0);
                      AttrMetas::operator=(&local_2e0->_metas,(AttrMetas *)(p_Var11 + 7));
                      pcVar14 = "purpose";
                      pcVar12 = "";
                      goto LAB_00208982;
                    }
                  }
                  else if ((code **)local_250._0_8_ != &local_240) {
                    local_340._0_8_ = psVar1;
                    operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
                  }
                }
                local_250._8_8_ = 0;
                local_250._0_8_ = PurposeEnumHandler;
                pcStack_238 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_240 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_340._0_8_ = psVar1;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"purpose","");
                bVar5 = options->strict_allowedToken_check;
                local_c8 = (code *)0x0;
                pcStack_c0 = (code *)0x0;
                local_d8._M_unused._M_object = (void *)0x0;
                local_d8._8_8_ = 0;
                if (local_240 != (code *)0x0) {
                  (*local_240)(&local_d8,(string *)local_250,2);
                  local_c8 = local_240;
                  pcStack_c0 = pcStack_238;
                }
                bVar5 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  ((string *)local_340,bVar5,
                                   (EnumHandlerFun<tinyusdz::Purpose> *)&local_d8,
                                   &local_310->_attrib,local_2e0,local_2e8,local_318);
                if (local_c8 != (code *)0x0) {
                  (*local_c8)(&local_d8,&local_d8,__destroy_functor);
                }
                if ((size_type *)local_340._0_8_ != psVar1) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                iVar6 = 1;
                if (bVar5) {
                  AttrMetas::operator=(&local_2e0->_metas,(AttrMetas *)(p_Var11 + 7));
                  pcVar14 = "purpose";
                  pcVar12 = "";
                  goto LAB_00208c8b;
                }
                goto LAB_00208cbd;
              }
            }
            else {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,*(long *)(p_Var11 + 1),
                         (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
              local_250._0_8_ = &local_240;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"extent","");
              args = local_310;
              anon_unknown_0::ParseExtentAttribute
                        ((ParseResult *)local_340,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2d0,&local_b8,local_310,(string *)local_250,local_298);
              if ((code **)local_250._0_8_ != &local_240) {
                operator_delete((void *)local_250._0_8_,(ulong)((long)local_240 + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              iVar6 = 0;
              if ((local_340._0_8_ & 0xfffffffd) == 0) {
                iVar6 = 3;
LAB_00208d62:
                bVar5 = false;
              }
              else {
                bVar5 = true;
                if (local_340._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_250,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_250,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_250,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"():",3)
                  ;
                  poVar7 = (ostream *)::std::ostream::operator<<((string *)local_250,0xc95);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  local_308[0] = local_2f8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_308,"Parsing attribute `extent` failed. Error: {}","");
                  fmt::format<std::__cxx11::string>
                            ((string *)&local_360,(fmt *)local_308,(string *)(local_340 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args);
                  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_250,local_360._M_dataplus._M_p,
                                      local_360._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._M_dataplus._M_p != &local_360.field_2) {
                    operator_delete(local_360._M_dataplus._M_p,
                                    local_360.field_2._M_allocated_capacity + 1);
                  }
                  psVar15 = local_318;
                  if (local_308[0] != local_2f8) {
                    operator_delete(local_308[0],local_2f8[0] + 1);
                  }
                  if (psVar15 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar8 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)local_308,(ulong)(psVar15->_M_dataplus)._M_p
                                               );
                    psVar1 = (size_type *)(plVar8 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar8 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_360.field_2._M_allocated_capacity = *psVar1;
                      local_360.field_2._8_8_ = plVar8[3];
                      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                    }
                    else {
                      local_360.field_2._M_allocated_capacity = *psVar1;
                      local_360._M_dataplus._M_p = (pointer)*plVar8;
                    }
                    local_360._M_string_length = plVar8[1];
                    *plVar8 = (long)psVar1;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)psVar15,(string *)&local_360);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_360._M_dataplus._M_p != &local_360.field_2) {
                      operator_delete(local_360._M_dataplus._M_p,
                                      local_360.field_2._M_allocated_capacity + 1);
                    }
                    if (local_308[0] != local_2f8) {
                      operator_delete(local_308[0],local_2f8[0] + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
                  ::std::ios_base::~ios_base(local_1e0);
                  iVar6 = 1;
                  goto LAB_00208d62;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._8_8_ != &aStack_328) {
                operator_delete((void *)local_340._8_8_,aStack_328._M_allocated_capacity + 1);
              }
              if (!bVar5) goto LAB_0020903d;
              cVar9 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_2d0,(key_type *)__k);
              p_Var16 = &local_2d0._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)cVar9._M_node == p_Var16) {
                pmVar10 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_2a0,(key_type *)__k);
                ::std::__cxx11::string::_M_assign((string *)pmVar10);
                (pmVar10->_attrib)._varying_authored = (bool)p_Var11[3].field_0x4;
                (pmVar10->_attrib)._variability = p_Var11[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar10->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar10->_attrib)._var,(any *)&p_Var11[4]._M_parent);
                (pmVar10->_attrib)._var._blocked = SUB41(p_Var11[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&(pmVar10->_attrib)._var._ts,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&p_Var11[5]._M_parent);
                (pmVar10->_attrib)._var._ts._dirty = SUB41(p_Var11[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar10->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var11[6]._M_parent);
                AttrMetas::operator=(&(pmVar10->_attrib)._metas,(AttrMetas *)(p_Var11 + 7));
                *(_Base_ptr *)&pmVar10->_listOpQual = p_Var11[0x17]._M_parent;
                (pmVar10->_rel).type = *(Type *)&p_Var11[0x17]._M_left;
                Path::operator=(&(pmVar10->_rel).targetPath,(Path *)&p_Var11[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar10->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var11[0x1e]._M_parent);
                (pmVar10->_rel).listOpQual = p_Var11[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar10->_rel)._metas,(AttrMetas *)&p_Var11[0x1f]._M_parent);
                (pmVar10->_rel)._varying_authored = *(bool *)&p_Var11[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar10->_prop_value_type_name);
                pmVar10->_has_custom = *(bool *)&p_Var11[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_2d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
              cVar9 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_2d0,(key_type *)__k);
              if ((_Rb_tree_header *)cVar9._M_node == p_Var16) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_250,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_250,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_250,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_250,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((string *)local_250,0xc97);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_340,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_250,(char *)local_340._0_8_,local_340._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                psVar1 = (size_type *)(local_340 + 0x10);
                if ((size_type *)local_340._0_8_ != psVar1) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                psVar15 = local_2e8;
                if (local_2e8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar8 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)&local_360,
                                              (ulong)(local_318->_M_dataplus)._M_p);
                  psVar2 = (size_type *)(plVar8 + 2);
                  if ((size_type *)*plVar8 == psVar2) {
                    local_340._16_8_ = *psVar2;
                    aStack_328._M_allocated_capacity = plVar8[3];
                    local_340._0_8_ = psVar1;
                  }
                  else {
                    local_340._16_8_ = *psVar2;
                    local_340._0_8_ = (size_type *)*plVar8;
                  }
                  local_340._8_8_ = plVar8[1];
                  *plVar8 = (long)psVar2;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar15,(string *)local_340);
                  if ((size_type *)local_340._0_8_ != psVar1) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._M_dataplus._M_p != &local_360.field_2) {
                    operator_delete(local_360._M_dataplus._M_p,
                                    local_360.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
                ::std::ios_base::~ios_base(local_1e0);
              }
            }
          }
        }
        else {
LAB_0020903d:
          if ((iVar6 != 3) && (iVar6 != 0)) {
            bVar13 = false;
            goto LAB_002090f3;
          }
        }
LAB_0020904c:
        p_Var11 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11);
      } while (p_Var11 != local_280);
      bVar13 = true;
    }
  }
LAB_002090f3:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_2d0,(_Link_type)local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar13;
}

Assistant:

bool ReconstructPrim<SphereLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SphereLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;

  (void)options;
  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:color", SphereLight, light->color)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", SphereLight, light->radius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:intensity", SphereLight,
                   light->intensity)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, SphereLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, SphereLight,
                       light->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, SphereLight, light->extent)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}